

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_gzip_external(CImg<unsigned_char> *this,char *filename)

{
  char *pcVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  CImg<char> *pCVar9;
  CImgIOException *pCVar10;
  ulong __maxlen;
  CImg<char> filename_tmp;
  CImg<char> command;
  CImg<char> body;
  CImg<char> local_70;
  CImg<char> local_50;
  
  if (filename == (char *)0x0) {
    pCVar10 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar4 = "non-";
    if (this->_is_shared != false) {
      pcVar4 = "";
    }
    CImgIOException::CImgIOException
              (pCVar10,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_gzip_external(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar4,"unsigned char");
    __cxa_throw(pCVar10,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  pFVar3 = cimg::fopen(filename,"rb");
  fclose(pFVar3);
  CImg<char>::CImg(&command,0x400,1,1,1);
  CImg<char>::CImg(&filename_tmp,0x100,1,1,1);
  CImg<char>::CImg(&body,0x100,1,1,1);
  pcVar4 = cimg::split_filename(filename,body._data);
  pcVar5 = cimg::split_filename(body._data,(char *)0x0);
  do {
    iVar2 = cimg::strcasecmp(pcVar4,"gz");
    pcVar1 = filename_tmp._data;
    __maxlen = (ulong)filename_tmp._width;
    if (iVar2 == 0) {
      if (*pcVar5 == '\0') {
        pcVar8 = cimg::temporary_path((char *)0x0,false);
        pcVar6 = cimg::filenamerand();
        goto LAB_0011c8a1;
      }
      pcVar6 = cimg::temporary_path((char *)0x0,false);
      pcVar7 = cimg::filenamerand();
      pcVar8 = pcVar5;
LAB_0011c874:
      snprintf(pcVar1,__maxlen,"%s%c%s.%s",pcVar6,0x2f,pcVar7,pcVar8);
    }
    else {
      if (*pcVar4 != '\0') {
        pcVar6 = cimg::temporary_path((char *)0x0,false);
        pcVar7 = cimg::filenamerand();
        pcVar8 = pcVar4;
        goto LAB_0011c874;
      }
      pcVar8 = cimg::temporary_path((char *)0x0,false);
      pcVar6 = cimg::filenamerand();
LAB_0011c8a1:
      snprintf(pcVar1,__maxlen,"%s%c%s",pcVar8,0x2f,pcVar6);
    }
    pFVar3 = fopen(filename_tmp._data,"rb");
    pcVar1 = command._data;
    if (pFVar3 == (FILE *)0x0) {
      pcVar5 = cimg::gunzip_path((char *)0x0,false);
      CImg<char>::string(&local_50,filename,true,false);
      pCVar9 = CImg<char>::_system_strescape(&local_50);
      pcVar4 = pCVar9->_data;
      CImg<char>::string(&local_70,filename_tmp._data,true,false);
      pCVar9 = CImg<char>::_system_strescape(&local_70);
      snprintf(pcVar1,(ulong)command._width,"%s -c \"%s\" > \"%s\"",pcVar5,pcVar4,pCVar9->_data);
      CImg<char>::~CImg(&local_70);
      CImg<char>::~CImg(&local_50);
      cimg::system(command._data);
      pFVar3 = fopen(filename_tmp._data,"rb");
      if (pFVar3 != (FILE *)0x0) {
        cimg::fclose(pFVar3);
        load(this,filename_tmp._data);
        remove(filename_tmp._data);
        CImg<char>::~CImg(&body);
        CImg<char>::~CImg(&filename_tmp);
        CImg<char>::~CImg(&command);
        return this;
      }
      pFVar3 = cimg::fopen(filename,"r");
      cimg::fclose(pFVar3);
      pCVar10 = (CImgIOException *)__cxa_allocate_exception(0x10);
      pcVar4 = "non-";
      if (this->_is_shared != false) {
        pcVar4 = "";
      }
      CImgIOException::CImgIOException
                (pCVar10,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_gzip_external(): Failed to load file \'%s\' with external command \'gunzip\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar4,"unsigned char",filename);
      __cxa_throw(pCVar10,&CImgIOException::typeinfo,CImgException::~CImgException);
    }
    cimg::fclose(pFVar3);
  } while( true );
}

Assistant:

CImg<T>& load_gzip_external(const char *const filename) {
      if (!filename)
        throw CImgIOException(_cimg_instance
                              "load_gzip_external(): Specified filename is (null).",
                              cimg_instance);
      std::fclose(cimg::fopen(filename,"rb"));            // Check if file exists.
      CImg<charT> command(1024), filename_tmp(256), body(256);
      const char
        *const ext = cimg::split_filename(filename,body),
        *const ext2 = cimg::split_filename(body,0);

      std::FILE *file = 0;
      do {
        if (!cimg::strcasecmp(ext,"gz")) {
          if (*ext2) cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s.%s",
                                   cimg::temporary_path(),cimg_file_separator,cimg::filenamerand(),ext2);
          else cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s",
                             cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        } else {
          if (*ext) cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s.%s",
                                  cimg::temporary_path(),cimg_file_separator,cimg::filenamerand(),ext);
          else cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s",
                             cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        }
        if ((file=std::fopen(filename_tmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,command._width,"%s -c \"%s\" > \"%s\"",
                    cimg::gunzip_path(),
                    CImg<charT>::string(filename)._system_strescape().data(),
                    CImg<charT>::string(filename_tmp)._system_strescape().data());
      cimg::system(command);
      if (!(file = std::fopen(filename_tmp,"rb"))) {
        cimg::fclose(cimg::fopen(filename,"r"));
        throw CImgIOException(_cimg_instance
                              "load_gzip_external(): Failed to load file '%s' with external command 'gunzip'.",
                              cimg_instance,
                              filename);

      } else cimg::fclose(file);
      load(filename_tmp);
      std::remove(filename_tmp);
      return *this;
    }